

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS
ref_recon_signed_hessian
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *hessian,REF_RECON_RECONSTRUCTION recon)

{
  int *piVar1;
  size_t sVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  REF_NODE pRVar8;
  REF_GLOB *pRVar9;
  REF_CELL pRVar10;
  REF_ADJ pRVar11;
  REF_INT *pRVar12;
  long lVar13;
  double dVar14;
  uint uVar15;
  REF_DBL *grad;
  REF_DBL *scalar_00;
  REF_DBL *grad_00;
  long *plVar16;
  REF_BOOL *replace;
  void *__s;
  REF_DBL *pRVar17;
  undefined8 uVar18;
  long lVar19;
  ulong uVar20;
  REF_BOOL *pRVar21;
  long lVar22;
  void *pvVar23;
  long lVar24;
  char *pcVar25;
  uint uVar26;
  long lVar27;
  REF_DBL *local_58;
  REF_DBL *local_50;
  REF_EDGE local_38;
  
  if (recon == REF_RECON_KEXACT) {
    uVar15 = ref_recon_kexact_gradient_hessian(ref_grid,scalar,(REF_DBL *)0x0,hessian);
    if (uVar15 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x599,
           "ref_recon_signed_hessian",(ulong)uVar15,"k-exact");
    return uVar15;
  }
  if (recon != REF_RECON_L2PROJECTION) {
    pcVar25 = "reconstruction not available";
    uVar18 = 0x59d;
    goto LAB_001cd02e;
  }
  pRVar8 = ref_grid->node;
  uVar20 = (ulong)(uint)pRVar8->max;
  if (pRVar8->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x17e,
           "ref_recon_l2_projection_hessian","malloc grad of REF_DBL negative");
    uVar15 = 1;
  }
  else {
    sVar2 = uVar20 * 0x18;
    grad = (REF_DBL *)malloc(sVar2);
    if (grad == (REF_DBL *)0x0) {
      pcVar25 = "malloc grad of REF_DBL NULL";
      uVar18 = 0x17e;
    }
    else {
      if (uVar20 == 0) {
        scalar_00 = (REF_DBL *)malloc(0);
        if (scalar_00 == (REF_DBL *)0x0) goto LAB_001cd12f;
        local_58 = (REF_DBL *)malloc(sVar2);
        if (local_58 == (REF_DBL *)0x0) goto LAB_001cd152;
        local_50 = (REF_DBL *)malloc(sVar2);
        if (local_50 == (REF_DBL *)0x0) goto LAB_001cd175;
        grad_00 = (REF_DBL *)malloc(sVar2);
LAB_001cd0e0:
        if (grad_00 == (REF_DBL *)0x0) {
          pcVar25 = "malloc gradz of REF_DBL NULL";
          uVar18 = 0x182;
          goto LAB_001cd1b9;
        }
        uVar15 = ref_recon_l2_projection_grad(ref_grid,scalar,grad);
        if ((uVar15 & 0xfffffffb) == 0) {
          iVar6 = pRVar8->max;
          if (0 < (long)iVar6) {
            pRVar9 = pRVar8->global;
            lVar19 = 0;
            pRVar17 = grad;
            do {
              if (-1 < pRVar9[lVar19]) {
                scalar_00[lVar19] = *pRVar17;
              }
              lVar19 = lVar19 + 1;
              pRVar17 = pRVar17 + 3;
            } while (iVar6 != lVar19);
          }
          uVar15 = ref_recon_l2_projection_grad(ref_grid,scalar_00,local_58);
          if ((uVar15 & 0xfffffffb) == 0) {
            iVar6 = pRVar8->max;
            if (0 < (long)iVar6) {
              pRVar17 = grad + 1;
              pRVar9 = pRVar8->global;
              lVar19 = 0;
              do {
                if (-1 < pRVar9[lVar19]) {
                  scalar_00[lVar19] = *pRVar17;
                }
                lVar19 = lVar19 + 1;
                pRVar17 = pRVar17 + 3;
              } while (iVar6 != lVar19);
            }
            uVar15 = ref_recon_l2_projection_grad(ref_grid,scalar_00,local_50);
            if ((uVar15 & 0xfffffffb) == 0) {
              iVar6 = pRVar8->max;
              if (0 < (long)iVar6) {
                pRVar17 = grad + 2;
                pRVar9 = pRVar8->global;
                lVar19 = 0;
                do {
                  if (-1 < pRVar9[lVar19]) {
                    scalar_00[lVar19] = *pRVar17;
                  }
                  lVar19 = lVar19 + 1;
                  pRVar17 = pRVar17 + 3;
                } while (iVar6 != lVar19);
              }
              uVar15 = ref_recon_l2_projection_grad(ref_grid,scalar_00,grad_00);
              if ((uVar15 & 0xfffffffb) == 0) {
                iVar6 = pRVar8->max;
                if (0 < (long)iVar6) {
                  plVar16 = pRVar8->global;
                  lVar19 = 0;
                  do {
                    if (-1 < *plVar16) {
                      *(undefined8 *)((long)hessian + lVar19 * 2) =
                           *(undefined8 *)((long)local_58 + lVar19);
                      pdVar3 = (double *)((long)local_58 + lVar19 + 8);
                      dVar14 = pdVar3[1];
                      dVar5 = *(double *)((long)grad_00 + lVar19);
                      pdVar4 = (double *)((long)hessian + lVar19 * 2 + 8);
                      *pdVar4 = (*(double *)((long)local_50 + lVar19) + *pdVar3) * 0.5;
                      pdVar4[1] = (dVar5 + dVar14) * 0.5;
                      *(undefined8 *)((long)hessian + lVar19 * 2 + 0x18) =
                           *(undefined8 *)((long)local_50 + lVar19 + 8);
                      *(double *)((long)hessian + lVar19 * 2 + 0x20) =
                           (*(double *)((long)local_50 + lVar19 + 0x10) +
                           *(double *)((long)grad_00 + lVar19 + 8)) * 0.5;
                      *(undefined8 *)((long)hessian + lVar19 * 2 + 0x28) =
                           *(undefined8 *)((long)grad_00 + lVar19 + 0x10);
                    }
                    lVar19 = lVar19 + 0x18;
                    plVar16 = plVar16 + 1;
                  } while ((long)iVar6 * 0x18 != lVar19);
                }
                free(grad_00);
                free(local_50);
                free(local_58);
                free(scalar_00);
                free(grad);
                pRVar8 = ref_grid->node;
                iVar6 = pRVar8->max;
                if ((long)iVar6 < 0) {
                  pcVar25 = "malloc replace of REF_BOOL negative";
                  uVar18 = 0x58c;
LAB_001cd02e:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,uVar18,"ref_recon_signed_hessian",pcVar25);
                  return 1;
                }
                uVar15 = iVar6 * 6;
                sVar2 = (ulong)uVar15 * 4;
                replace = (REF_BOOL *)malloc(sVar2);
                if (replace == (REF_BOOL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x58c,"ref_recon_signed_hessian","malloc replace of REF_BOOL NULL");
                  return 2;
                }
                if (ref_grid->twod == 0) {
                  ref_recon_mask_tri(ref_grid,replace,6);
LAB_001cd537:
                  __s = malloc(sVar2);
                  if (__s != (void *)0x0) {
                    if (iVar6 != 0) {
                      uVar20 = 1;
                      if (1 < (int)uVar15) {
                        uVar20 = (ulong)uVar15;
                      }
                      memset(__s,0,uVar20 << 2);
                    }
                    goto LAB_001cd578;
                  }
LAB_001cd5b1:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x56b,"ref_recon_skip_orphan_replace",
                         "malloc contributions of REF_INT NULL");
                  uVar15 = 2;
                }
                else {
                  if (iVar6 != 0) {
                    pRVar10 = ref_grid->cell[0];
                    pRVar9 = pRVar8->global;
                    uVar20 = 0;
                    pRVar21 = replace;
                    do {
                      if (-1 < pRVar9[uVar20]) {
                        pRVar11 = pRVar10->ref_adj;
                        iVar7 = pRVar11->nnode;
                        lVar19 = 0;
                        do {
                          uVar26 = 0;
                          if ((long)uVar20 < (long)iVar7) {
                            uVar26 = (uint)(pRVar11->first[uVar20] != -1);
                          }
                          pRVar21[lVar19] = uVar26;
                          lVar19 = lVar19 + 1;
                        } while (lVar19 != 6);
                      }
                      uVar20 = uVar20 + 1;
                      pRVar21 = pRVar21 + 6;
                    } while (uVar20 < (ulong)(long)iVar6);
                    goto LAB_001cd537;
                  }
                  __s = malloc(sVar2);
                  if (__s == (void *)0x0) goto LAB_001cd5b1;
LAB_001cd578:
                  uVar15 = ref_edge_create(&local_38,ref_grid);
                  if (uVar15 == 0) {
                    iVar6 = local_38->n;
                    if (0 < (long)iVar6) {
                      pRVar12 = local_38->e2n;
                      lVar19 = 0;
                      do {
                        lVar22 = (long)pRVar12[lVar19 * 2];
                        lVar24 = (long)(pRVar12[lVar19 * 2 + 1] * 6);
                        lVar27 = 0;
                        do {
                          if (replace[lVar22 * 6 + lVar27] == 0) {
                            lVar13 = lVar24;
                            if (replace[lVar24 + lVar27] != 0) goto LAB_001cd63a;
                          }
                          else {
                            lVar13 = lVar22 * 6;
                            if (replace[lVar24 + lVar27] == 0) {
LAB_001cd63a:
                              piVar1 = (int *)((long)__s + (lVar27 + lVar13) * 4);
                              *piVar1 = *piVar1 + 1;
                            }
                          }
                          lVar27 = lVar27 + 1;
                        } while (lVar27 != 6);
                        lVar19 = lVar19 + 1;
                      } while (lVar19 != iVar6);
                    }
                    uVar15 = ref_edge_free(local_38);
                    if (uVar15 == 0) {
                      iVar6 = pRVar8->max;
                      if (0 < (long)iVar6) {
                        pRVar9 = pRVar8->global;
                        uVar20 = 0;
                        pvVar23 = __s;
                        pRVar21 = replace;
                        do {
                          if (-1 < pRVar9[uVar20]) {
                            lVar19 = 0;
                            do {
                              if (*(int *)((long)pvVar23 + lVar19 * 4) == 0) {
                                pRVar21[lVar19] = 0;
                              }
                              lVar19 = lVar19 + 1;
                            } while (lVar19 != 6);
                          }
                          uVar20 = uVar20 + 1;
                          pRVar21 = pRVar21 + 6;
                          pvVar23 = (void *)((long)pvVar23 + 0x18);
                        } while (uVar20 < (ulong)(long)iVar6);
                      }
                      free(__s);
                      uVar15 = ref_recon_extrapolate_zeroth(ref_grid,hessian,replace,6);
                      if (uVar15 == 0) {
                        free(replace);
                        return 0;
                      }
                      pcVar25 = "bound extrap";
                      uVar18 = 0x594;
                      goto LAB_001cd1e6;
                    }
                    pcVar25 = "free edge";
                    uVar18 = 0x579;
                  }
                  else {
                    pcVar25 = "edges";
                    uVar18 = 0x56c;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,uVar18,"ref_recon_skip_orphan_replace",(ulong)uVar15,pcVar25);
                }
                pcVar25 = "skip orphans";
                uVar18 = 0x592;
                goto LAB_001cd1e6;
              }
              pcVar25 = "gradz";
              uVar18 = 0x194;
            }
            else {
              pcVar25 = "grady";
              uVar18 = 399;
            }
          }
          else {
            pcVar25 = "gradx";
            uVar18 = 0x18a;
          }
        }
        else {
          pcVar25 = "l2 grad";
          uVar18 = 0x185;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               uVar18,"ref_recon_l2_projection_hessian",(ulong)uVar15,pcVar25);
        goto LAB_001cd1c5;
      }
      memset(grad,0,sVar2);
      scalar_00 = (REF_DBL *)calloc(1,uVar20 * 8);
      if (scalar_00 == (REF_DBL *)0x0) {
LAB_001cd12f:
        pcVar25 = "malloc dsdx of REF_DBL NULL";
        uVar18 = 0x17f;
      }
      else {
        local_58 = (REF_DBL *)calloc(1,sVar2);
        if (local_58 == (REF_DBL *)0x0) {
LAB_001cd152:
          pcVar25 = "malloc gradx of REF_DBL NULL";
          uVar18 = 0x180;
        }
        else {
          local_50 = (REF_DBL *)calloc(1,sVar2);
          if (local_50 != (REF_DBL *)0x0) {
            grad_00 = (REF_DBL *)calloc(1,sVar2);
            goto LAB_001cd0e0;
          }
LAB_001cd175:
          pcVar25 = "malloc grady of REF_DBL NULL";
          uVar18 = 0x181;
        }
      }
    }
LAB_001cd1b9:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar18,
           "ref_recon_l2_projection_hessian",pcVar25);
    uVar15 = 2;
  }
LAB_001cd1c5:
  pcVar25 = "l2";
  uVar18 = 0x58b;
LAB_001cd1e6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar18,
         "ref_recon_signed_hessian",(ulong)uVar15,pcVar25);
  return uVar15;
}

Assistant:

REF_FCN REF_STATUS ref_recon_signed_hessian(REF_GRID ref_grid, REF_DBL *scalar,
                                            REF_DBL *hessian,
                                            REF_RECON_RECONSTRUCTION recon) {
  REF_BOOL *replace;

  switch (recon) {
    case REF_RECON_L2PROJECTION:
      RSS(ref_recon_l2_projection_hessian(ref_grid, scalar, hessian), "l2");
      ref_malloc(replace, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_BOOL);
      if (ref_grid_twod(ref_grid)) {
        RSS(ref_recon_mask_edg(ref_grid, replace, 6), "mask edg");
      } else {
        RSS(ref_recon_mask_tri(ref_grid, replace, 6), "mask tri");
      }
      RSS(ref_recon_skip_orphan_replace(ref_grid, replace, 6), "skip orphans");
      RSS(ref_recon_extrapolate_zeroth(ref_grid, hessian, replace, 6),
          "bound extrap");
      ref_free(replace);
      break;
    case REF_RECON_KEXACT:
      RSS(ref_recon_kexact_gradient_hessian(ref_grid, scalar, NULL, hessian),
          "k-exact");
      break;
    case REF_RECON_LAST:
    default:
      THROW("reconstruction not available");
  }

  return REF_SUCCESS;
}